

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::blendFuncSeparate
          (ReferenceContext *this,deUint32 srcRGB,deUint32 dstRGB,deUint32 srcAlpha,
          deUint32 dstAlpha)

{
  bool bVar1;
  
  bVar1 = isValidBlendFactor(srcRGB);
  if ((((bVar1) && (bVar1 = isValidBlendFactor(dstRGB), bVar1)) &&
      (bVar1 = isValidBlendFactor(srcAlpha), bVar1)) &&
     (bVar1 = isValidBlendFactor(dstAlpha), bVar1)) {
    this->m_blendFactorSrcRGB = srcRGB;
    this->m_blendFactorSrcAlpha = srcAlpha;
    this->m_blendFactorDstRGB = dstRGB;
    this->m_blendFactorDstAlpha = dstAlpha;
    return;
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x500;
  }
  return;
}

Assistant:

void ReferenceContext::blendFuncSeparate (deUint32 srcRGB, deUint32 dstRGB, deUint32 srcAlpha, deUint32 dstAlpha)
{
	RC_IF_ERROR(!isValidBlendFactor(srcRGB)		||
				!isValidBlendFactor(dstRGB)		||
				!isValidBlendFactor(srcAlpha)	||
				!isValidBlendFactor(dstAlpha),
				GL_INVALID_ENUM, RC_RET_VOID);

	m_blendFactorSrcRGB		= srcRGB;
	m_blendFactorSrcAlpha	= srcAlpha;
	m_blendFactorDstRGB		= dstRGB;
	m_blendFactorDstAlpha	= dstAlpha;
}